

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

void __thiscall ot::commissioner::coap::Coap::RequestsCache::UpdateTimer(RequestsCache *this)

{
  bool bVar1;
  TimePoint aFireTime;
  
  bVar1 = (this->mRetransmissionTimer).mEnabled;
  if ((this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    if (bVar1 != false) {
      event_del((event *)this);
    }
    (this->mRetransmissionTimer).mEnabled = false;
  }
  else {
    aFireTime.__d.__r =
         *(duration *)((this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 3);
    if ((bVar1 == false) ||
       ((long)aFireTime.__d.__r < (this->mRetransmissionTimer).mFireTime.__d.__r)) {
      Timer::Start(&this->mRetransmissionTimer,aFireTime);
      return;
    }
  }
  return;
}

Assistant:

void Coap::RequestsCache::UpdateTimer()
{
    if (IsEmpty())
    {
        mRetransmissionTimer.Stop();
    }
    else if (!mRetransmissionTimer.IsRunning() || Earliest() < mRetransmissionTimer.GetFireTime())
    {
        mRetransmissionTimer.Start(Earliest());
    }
}